

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

int IoCommandReadPlaMo(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  char *pcVar2;
  uint fVerbose;
  uint fMerge;
  char *pcVar3;
  
  fMerge = 0;
  Extra_UtilGetoptReset();
  fVerbose = 0;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"mvh"), iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) break;
    if (iVar1 != 0x6d) goto LAB_00326259;
    fMerge = fMerge ^ 1;
  }
  if (globalUtilOptind + 1 == argc) {
    pNtk = Mop_ManTest(argv[globalUtilOptind],fMerge,fVerbose);
    if (pNtk == (Abc_Ntk_t *)0x0) {
      return 1;
    }
    Abc_FrameReplaceCurrentNetwork(pAbc,pNtk);
    Abc_FrameClearVerifStatus(pAbc);
    return 0;
  }
LAB_00326259:
  fwrite("usage: read_plamo [-mvh] <file>\n",0x20,1,(FILE *)pAbc->Err);
  fwrite("\t         reads the network in multi-output PLA\n",0x30,1,(FILE *)pAbc->Err);
  pcVar3 = "yes";
  pcVar2 = "yes";
  if (fMerge == 0) {
    pcVar2 = "no";
  }
  fprintf((FILE *)pAbc->Err,
          "\t-m     : toggle dist-1 merge for cubes with identical outputs [default = %s]\n",pcVar2)
  ;
  if (fVerbose == 0) {
    pcVar3 = "no";
  }
  fprintf((FILE *)pAbc->Err,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3
         );
  fwrite("\t-h     : prints the command summary\n",0x25,1,(FILE *)pAbc->Err);
  fwrite("\tfile   : the name of a file to read\n",0x25,1,(FILE *)pAbc->Err);
  return 1;
}

Assistant:

int IoCommandReadPlaMo( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Abc_Ntk_t * Mop_ManTest( char * pFileName, int fMerge, int fVerbose );
    Abc_Ntk_t * pNtk;
    int c, fMerge = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "mvh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'm':
                fMerge ^= 1;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the input file name
    pNtk = Mop_ManTest( argv[globalUtilOptind], fMerge, fVerbose );
    if ( pNtk == NULL )
        return 1;
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtk );
    Abc_FrameClearVerifStatus( pAbc );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: read_plamo [-mvh] <file>\n" );
    fprintf( pAbc->Err, "\t         reads the network in multi-output PLA\n" );
    fprintf( pAbc->Err, "\t-m     : toggle dist-1 merge for cubes with identical outputs [default = %s]\n", fMerge? "yes":"no" );
    fprintf( pAbc->Err, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes":"no" );
    fprintf( pAbc->Err, "\t-h     : prints the command summary\n" );
    fprintf( pAbc->Err, "\tfile   : the name of a file to read\n" );
    return 1;
}